

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O2

size_t ZSTD_fseBitCost(FSE_CTable *ctable,uint *count,uint max)

{
  ushort uVar1;
  byte bVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar1 = (ushort)*ctable;
  bVar2 = (byte)uVar1;
  lVar5 = 1;
  if (uVar1 != 0) {
    lVar5 = (long)(1 << (bVar2 - 1 & 0x1f));
  }
  sVar7 = 0xffffffffffffffff;
  if (max <= *(ushort *)((long)ctable + 2)) {
    uVar6 = 0;
    for (lVar3 = 0; (ulong)max + 1 != lVar3; lVar3 = lVar3 + 1) {
      if (0xf < uVar1) {
        __assert_fail("tableLog < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/fse.h"
                      ,0x1f2,"U32 FSE_bitCost(const void *, U32, U32, U32)");
      }
      iVar4 = (ctable[lVar5 + lVar3 * 2 + 2] >> 0x10) + 1;
      uVar8 = iVar4 * 0x10000;
      uVar10 = ctable[lVar5 + lVar3 * 2 + 2] + (1 << (bVar2 & 0x1f));
      uVar9 = (uVar8 - uVar10) * 0x100 >> (bVar2 & 0x1f);
      if (uVar8 < uVar10) {
        __assert_fail("symbolTT[symbolValue].deltaNbBits + tableSize <= threshold",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/fse.h"
                      ,0x1f8,"U32 FSE_bitCost(const void *, U32, U32, U32)");
      }
      if (0x100 < uVar9) {
        __assert_fail("normalizedDeltaFromThreshold <= bitMultiplier",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/fse.h"
                      ,0x1f9,"U32 FSE_bitCost(const void *, U32, U32, U32)");
      }
      if ((ulong)count[lVar3] != 0) {
        uVar9 = iVar4 * 0x100 - uVar9;
        if ((uint)uVar1 * 0x100 + 0x100 <= uVar9) {
          return 0xffffffffffffffff;
        }
        uVar6 = uVar6 + (ulong)count[lVar3] * (ulong)uVar9;
      }
    }
    sVar7 = uVar6 >> 8;
  }
  return sVar7;
}

Assistant:

size_t ZSTD_fseBitCost(
    FSE_CTable const* ctable,
    unsigned const* count,
    unsigned const max)
{
    unsigned const kAccuracyLog = 8;
    size_t cost = 0;
    unsigned s;
    FSE_CState_t cstate;
    FSE_initCState(&cstate, ctable);
    if (ZSTD_getFSEMaxSymbolValue(ctable) < max) {
        DEBUGLOG(5, "Repeat FSE_CTable has maxSymbolValue %u < %u",
                    ZSTD_getFSEMaxSymbolValue(ctable), max);
        return ERROR(GENERIC);
    }
    for (s = 0; s <= max; ++s) {
        unsigned const tableLog = cstate.stateLog;
        unsigned const badCost = (tableLog + 1) << kAccuracyLog;
        unsigned const bitCost = FSE_bitCost(cstate.symbolTT, tableLog, s, kAccuracyLog);
        if (count[s] == 0)
            continue;
        if (bitCost >= badCost) {
            DEBUGLOG(5, "Repeat FSE_CTable has Prob[%u] == 0", s);
            return ERROR(GENERIC);
        }
        cost += (size_t)count[s] * bitCost;
    }
    return cost >> kAccuracyLog;
}